

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLText * __thiscall tinyxml2::XMLDocument::NewText(XMLDocument *this,char *str)

{
  XMLText *this_00;
  XMLText *text;
  char *str_local;
  XMLDocument *this_local;
  
  this_00 = (XMLText *)MemPoolT<96>::Alloc(&this->_textPool);
  XMLText::XMLText(this_00,this);
  (this_00->super_XMLNode)._memPool = &(this->_textPool).super_MemPool;
  XMLNode::SetValue((XMLNode *)this_00,str,false);
  return this_00;
}

Assistant:

XMLText* XMLDocument::NewText( const char* str )
{
    TIXMLASSERT( sizeof( XMLText ) == _textPool.ItemSize() );
    XMLText* text = new (_textPool.Alloc()) XMLText( this );
    text->_memPool = &_textPool;
    text->SetValue( str );
    return text;
}